

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

void __thiscall cmFindPackageCommand::FillPrefixesSystemRegistry(cmFindPackageCommand *this)

{
  mapped_type *searchPath;
  string local_68;
  allocator<char> local_31;
  undefined1 local_30 [8];
  string debugBuffer;
  cmFindPackageCommand *this_local;
  
  if ((((this->NoSystemRegistry & 1U) == 0) &&
      (((this->super_cmFindCommon).NoDefaultPath & 1U) == 0)) &&
     (((this->super_cmFindCommon).DebugMode & 1U) != 0)) {
    debugBuffer.field_2._8_8_ = this;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_30,
               "CMake System Package Registry [CMAKE_FIND_PACKAGE_NO_SYSTEM_PACKAGE_REGISTRY].\n",
               &local_31);
    std::allocator<char>::~allocator(&local_31);
    searchPath = std::
                 map<cmFindCommon::PathLabel,_cmSearchPath,_std::less<cmFindCommon::PathLabel>,_std::allocator<std::pair<const_cmFindCommon::PathLabel,_cmSearchPath>_>_>
                 ::operator[](&(this->super_cmFindCommon).LabeledPaths,
                              &PathLabel::SystemRegistry.super_PathLabel);
    anon_unknown.dwarf_e82c04::collectPathsForDebug((string *)local_30,searchPath,0);
    cmStrCat<std::__cxx11::string&,std::__cxx11::string&>
              (&local_68,&this->DebugBuffer,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
    std::__cxx11::string::operator=((string *)&this->DebugBuffer,(string *)&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)local_30);
  }
  return;
}

Assistant:

void cmFindPackageCommand::FillPrefixesSystemRegistry()
{
  if (this->NoSystemRegistry || this->NoDefaultPath) {
    return;
  }

#if defined(_WIN32) && !defined(__CYGWIN__)
  this->LoadPackageRegistryWinSystem();
#endif

  if (this->DebugMode) {
    std::string debugBuffer =
      "CMake System Package Registry "
      "[CMAKE_FIND_PACKAGE_NO_SYSTEM_PACKAGE_REGISTRY].\n";
    collectPathsForDebug(debugBuffer,
                         this->LabeledPaths[PathLabel::SystemRegistry]);
    this->DebugBuffer = cmStrCat(this->DebugBuffer, debugBuffer);
  }
}